

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingState<int,_int>::CalculateDeltaStats(BitpackingState<int,_int> *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int32_t right;
  ulong uVar5;
  int32_t left;
  int *piVar6;
  int64_t i;
  int bogus;
  int32_t local_1c;
  
  if ((1 < this->compression_buffer_idx) && (this->all_valid == true)) {
    bVar1 = TrySubtractOperator::Operation<int,int,int>(this->minimum,this->maximum,&local_1c);
    if ((bVar1) &&
       (bVar1 = TrySubtractOperator::Operation<int,int,int>(this->maximum,this->minimum,&local_1c),
       bVar1)) {
      uVar2 = this->compression_buffer_idx;
      piVar6 = this->compression_buffer;
      uVar4 = 0;
      uVar5 = 0;
      if (0 < (long)uVar2) {
        uVar5 = uVar2;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        this->delta_buffer[uVar4] = piVar6[uVar4] - piVar6[uVar4 - 1];
      }
LAB_004c740b:
      this->can_do_delta = true;
      right = this->minimum_delta;
      left = this->maximum_delta;
      for (lVar3 = 0x805; lVar3 - 0x804U < uVar2; lVar3 = lVar3 + 1) {
        if (left <= this->compression_buffer_internal[lVar3]) {
          left = this->compression_buffer_internal[lVar3];
        }
        this->maximum_delta = left;
        if (this->compression_buffer_internal[lVar3] <= right) {
          right = this->compression_buffer_internal[lVar3];
        }
        this->minimum_delta = right;
      }
      this->delta_buffer[0] = right;
      bVar1 = TrySubtractOperator::Operation<int,int,int>(left,right,&this->min_max_delta_diff);
      this->can_do_delta = bVar1;
      if (bVar1) {
        bVar1 = TrySubtractOperator::Operation<int,int,int>
                          (*this->compression_buffer,this->minimum_delta,&this->delta_offset);
      }
      else {
        bVar1 = false;
      }
      this->can_do_delta = bVar1;
    }
    else {
      piVar6 = this->delta_buffer;
      lVar3 = 0;
      do {
        uVar2 = this->compression_buffer_idx;
        if ((long)uVar2 <= lVar3) goto LAB_004c740b;
        bVar1 = TrySubtractOperator::Operation<int,int,int>
                          (this->compression_buffer[lVar3],this->compression_buffer[lVar3 + -1],
                           piVar6);
        lVar3 = lVar3 + 1;
        piVar6 = piVar6 + 1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}